

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

void init_tree(log_multi *d)

{
  node *new_ele;
  long in_RDI;
  v_array<node> *in_stack_ffffffffffffffa0;
  
  new_ele = (node *)(in_RDI + 8);
  init_node();
  v_array<node>::push_back(in_stack_ffffffffffffffa0,new_ele);
  *(undefined4 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

void init_tree(log_multi& d)
{
  d.nodes.push_back(init_node());
  d.nbofswaps = 0;
}